

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaMultiGenerator::OrderDependsTargetForTarget
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,
          cmGeneratorTarget *target,string *config)

{
  string *psVar1;
  char local_b1;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  local_60.View_._M_len = 0x22;
  local_60.View_._M_str = "cmake_object_order_depends_target_";
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_90.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_90.View_._M_len = psVar1->_M_string_length;
  local_b1 = '_';
  cmsys::SystemTools::UpperCase(&local_b0,config);
  cmStrCat<char,std::__cxx11::string>
            (__return_storage_ptr__,&local_60,&local_90,&local_b1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::OrderDependsTargetForTarget(
  cmGeneratorTarget const* target, const std::string& config) const
{
  return cmStrCat("cmake_object_order_depends_target_", target->GetName(), '_',
                  cmSystemTools::UpperCase(config));
}